

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool google::protobuf::FileOptions_OptimizeMode_IsValid(int value)

{
  int value_local;
  
  return value - 1U < 3;
}

Assistant:

bool FileOptions_OptimizeMode_IsValid(int value) {
  switch (value) {
    case 1:
    case 2:
    case 3:
      return true;
    default:
      return false;
  }
}